

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O3

int open_read(char *s)

{
  FILE *pFVar1;
  
  lineno = 1;
  if (s == (char *)0x0) {
    s = "stdin";
    pFVar1 = _stdin;
  }
  else {
    pFVar1 = fl_fopen(s,"r");
    if (pFVar1 == (FILE *)0x0) {
      return 0;
    }
  }
  fname = s;
  fin = pFVar1;
  return 1;
}

Assistant:

int open_read(const char *s) {
  lineno = 1;
  if (!s) {fin = stdin; fname = "stdin"; return 1;}
  FILE *f = fl_fopen(s,"r");
  if (!f) return 0;
  fin = f;
  fname = s;
  return 1;
}